

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FloorDivBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_floordivbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  FloorDivBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_floordivbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_floordivbroadcastable(this);
    this_00 = (FloorDivBroadcastableLayerParams *)operator_new(0x18);
    FloorDivBroadcastableLayerParams::FloorDivBroadcastableLayerParams(this_00);
    (this->layer_).floordivbroadcastable_ = this_00;
  }
  return (FloorDivBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FloorDivBroadcastableLayerParams* NeuralNetworkLayer::mutable_floordivbroadcastable() {
  if (!has_floordivbroadcastable()) {
    clear_layer();
    set_has_floordivbroadcastable();
    layer_.floordivbroadcastable_ = new ::CoreML::Specification::FloorDivBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.floorDivBroadcastable)
  return layer_.floordivbroadcastable_;
}